

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavUtility.cpp
# Opt level: O0

WavHeaderTypeGroup WavParserHelper::GetWavHeaderType(ifstream *in_File)

{
  WavHeaderTypeGroup WVar1;
  bool bVar2;
  int iVar3;
  char local_36 [4];
  char local_32 [4];
  char ckID_4 [4];
  char ckID_3 [4];
  char ckID_2 [4];
  char ckID_1 [4];
  char ckID [4];
  short wavHeaderSubType;
  long wavHeaderType;
  ifstream *in_File_local;
  WavHeaderTypeGroup HeaderTypeGroup;
  
  bVar2 = std::ios::operator_cast_to_bool((ios *)(in_File + *(long *)(*(long *)in_File + -0x18)));
  if (bVar2) {
    std::istream::seekg((long)in_File,0x10);
    std::istream::read((char *)in_File,(long)(ckID_1 + 2));
    std::istream::read((char *)in_File,(long)ckID_1);
    if (stack0xffffffffffffffe0 == 0x10) {
      std::istream::seekg((long)in_File,0x24);
      std::istream::read((char *)in_File,(long)ckID_2);
      iVar3 = strncmp(ckID_2,"data",4);
      if (iVar3 == 0) {
        in_File_local._0_4_ = Standard;
      }
      else {
        iVar3 = strncmp(ckID_2,"bext",4);
        if (iVar3 == 0) {
          in_File_local._0_4_ = Bwf;
          in_File_local._4_4_ = Normal;
        }
        else {
          in_File_local._0_4_ = Invalid;
        }
      }
    }
    else if (stack0xffffffffffffffe0 == 0x12) {
      in_File_local._0_4_ = NonPCM;
      std::istream::seekg((long)in_File,0x26);
      std::istream::read((char *)in_File,(long)ckID_3);
      iVar3 = strncmp(ckID_3,"fact",4);
      if (iVar3 == 0) {
        in_File_local._4_4_ = Normal;
      }
    }
    else if (stack0xffffffffffffffe0 == 0x1c) {
      in_File_local._0_4_ = Bwf;
      std::istream::seekg((long)in_File,_S_beg);
      std::istream::read((char *)in_File,(long)ckID_4);
      iVar3 = strncmp(ckID_4,"RF64",4);
      if (iVar3 == 0) {
        in_File_local._4_4_ = RF64;
      }
      else {
        in_File_local._4_4_ = Normal;
      }
    }
    else if (stack0xffffffffffffffe0 == 0x28) {
      std::istream::seekg((long)in_File,0x24);
      std::istream::read((char *)in_File,(long)local_32);
      iVar3 = strncmp(local_32,"data",4);
      if ((iVar3 == 0) || (iVar3 = strncmp(local_32,"bext",4), iVar3 == 0)) {
        in_File_local._0_4_ = Bwf;
      }
      else {
        in_File_local._0_4_ = Extensible;
        std::istream::seekg((long)in_File,0x3c);
        std::istream::read((char *)in_File,(long)local_36);
        iVar3 = strncmp(local_36,"fact",4);
        if (iVar3 == 0) {
          in_File_local._4_4_ = Normal;
        }
        else {
          in_File_local._4_4_ = NoFact;
        }
      }
    }
    else {
      in_File_local._0_4_ = Invalid;
    }
    if ((short)ckID_1._0_2_ == 0xfffe) {
      in_File_local._4_4_ = Extensible;
    }
  }
  WVar1.SubType = in_File_local._4_4_;
  WVar1.MajorType = (WavHeaderType)in_File_local;
  return WVar1;
}

Assistant:

WavHeaderTypeGroup WavParserHelper::GetWavHeaderType(std::ifstream &in_File)
{
	WavHeaderTypeGroup HeaderTypeGroup;

	if (in_File)
	{

		long wavHeaderType;
		in_File.seekg(16, std::ios_base::beg);
		in_File.read(reinterpret_cast<char *>(&wavHeaderType), sizeof(wavHeaderType));

		short wavHeaderSubType;
		in_File.read(reinterpret_cast<char *>(&wavHeaderSubType), sizeof(wavHeaderSubType));

		//Three Big Type : PCM / Non-PCM / Extensible
		if (wavHeaderType == 16)
		{
			in_File.seekg(36, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));

			//Standard PCM
			if (!std::strncmp(ckID, "data", 4))
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Standard;
			}
			//StandardBWF
			else if (!std::strncmp(ckID, "bext", 4))
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Bwf;

				HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
			}
			else
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Invalid;
			}
		}
		else if (wavHeaderType == 18)
		{
			HeaderTypeGroup.MajorType = WavHeaderType::NonPCM;

			in_File.seekg(38, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));
			if (!std::strncmp(ckID, "fact", 4))
				HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
		}
		else if (wavHeaderType == 28)
		{
			HeaderTypeGroup.MajorType = WavHeaderType::Bwf;

			in_File.seekg(0, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));

			if (!std::strncmp(ckID, "RF64", 4))
				HeaderTypeGroup.SubType = WavHeaderSubType::RF64;
			else
				HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
		}
		else if (wavHeaderType == 40)
		{
			in_File.seekg(36, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));
			if (!std::strncmp(ckID, "data", 4) || !std::strncmp(ckID, "bext", 4))
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Bwf;
			}
			else
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Extensible;

				in_File.seekg(60, std::ios_base::beg);
				char ckID[4];
				in_File.read(ckID, sizeof(ckID));
				if (!std::strncmp(ckID, "fact", 4))
					HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
				else
					HeaderTypeGroup.SubType = WavHeaderSubType::NoFact;
			}
		}
		else
		{
			HeaderTypeGroup.MajorType = WavHeaderType::Invalid;
		}

		if (wavHeaderSubType == 0xFFFE)
			HeaderTypeGroup.SubType = WavHeaderSubType::Extensible;
	}

	return HeaderTypeGroup;
}